

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O3

void Cgt_SimulationRecord(Cgt_Man_t *p)

{
  uint *puVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  void **ppvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  size_t __n;
  
  pVVar3 = p->pPart->vObjs;
  iVar4 = pVVar3->nSize;
  if (0 < iVar4) {
    ppvVar5 = pVVar3->pArray;
    lVar9 = 0;
    do {
      if (ppvVar5[lVar9] != (void *)0x0) {
        iVar2 = p->pCnf->pVarNums[lVar9];
        if (((long)iVar2 < 0) || (p->pSat->size <= iVar2)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        if (p->pSat->model[iVar2] == 1) {
          if (p->vPatts->nSize <= lVar9) goto LAB_004ed784;
          puVar1 = (uint *)((long)p->vPatts->pArray[lVar9] + (long)(p->nPatts >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)p->nPatts & 0x1f);
          iVar4 = pVVar3->nSize;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar4);
  }
  iVar4 = p->nPatts + 1;
  p->nPatts = iVar4;
  if (iVar4 == p->nPattWords << 5) {
    pVVar3 = p->vPatts;
    lVar9 = (long)pVVar3->nSize;
    if (lVar9 < 2) {
      __assert_fail("Vec_PtrSize(vInfo) > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x456,"void Vec_PtrReallocSimInfo(Vec_Ptr_t *)");
    }
    iVar4 = (int)((ulong)((long)pVVar3->pArray[1] - (long)*pVVar3->pArray) >> 2);
    lVar8 = (long)(iVar4 * 2);
    ppvVar5 = (void **)malloc((lVar8 * 4 + 8) * lVar9);
    lVar6 = lVar9 * 8;
    lVar7 = 0;
    do {
      ppvVar5[lVar7] = (void *)((long)ppvVar5 + lVar6);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + lVar8 * 4;
    } while (lVar9 != lVar7);
    lVar6 = 0;
    do {
      if (lVar9 == lVar6) {
LAB_004ed784:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      memcpy(ppvVar5[lVar6],pVVar3->pArray[lVar6],(long)(iVar4 << 2));
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar3->nSize);
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
    }
    pVVar3->pArray = ppvVar5;
    pVVar3 = p->vPatts;
    if (0 < pVVar3->nSize) {
      __n = (long)p->nPattWords * 4;
      lVar9 = 0;
      do {
        memset((void *)((long)pVVar3->pArray[lVar9] + __n),0,__n);
        lVar9 = lVar9 + 1;
      } while (lVar9 < pVVar3->nSize);
    }
    p->nPattWords = p->nPattWords << 1;
  }
  return;
}

Assistant:

void Cgt_SimulationRecord( Cgt_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p->pPart, pObj, i )
        if ( sat_solver_var_value( p->pSat, p->pCnf->pVarNums[i] ) )
            Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vPatts, i), p->nPatts );
    p->nPatts++;
    if ( p->nPatts == 32 * p->nPattWords )
    {
        Vec_PtrReallocSimInfo( p->vPatts );
        Vec_PtrCleanSimInfo( p->vPatts, p->nPattWords, 2 * p->nPattWords );
        p->nPattWords *= 2;
    }
}